

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O1

type_conflict2
jsoncons::detail::from_integer<long,std::__cxx11::string>
          (long value,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  bool bVar1;
  assertion_error *this;
  long lVar2;
  ulong uVar3;
  type_conflict2 tVar4;
  type_conflict2 tVar5;
  byte *pbVar6;
  char_type buf [255];
  string local_148;
  byte local_128 [264];
  
  tVar5 = 0;
  lVar2 = value;
  uVar3 = value;
  if (value < 0) {
    do {
      local_128[tVar5] = 0x30 - ((char)lVar2 + (char)(lVar2 / 10) * -10);
      tVar4 = tVar5 + 1;
      if (0xfd < tVar5) break;
      uVar3 = lVar2 - 10;
      lVar2 = lVar2 / 10;
      tVar5 = tVar4;
    } while (uVar3 < 0xffffffffffffffed);
  }
  else {
    do {
      local_128[tVar5] = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
      tVar4 = tVar5 + 1;
      if (0xfd < tVar5) break;
      bVar1 = 9 < uVar3;
      uVar3 = uVar3 / 10;
      tVar5 = tVar4;
    } while (bVar1);
  }
  if (tVar4 == 0xff) {
    this = (assertion_error *)__cxa_allocate_exception(0x10);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"assertion \'p != last\' failed at  <> :0","");
    assertion_error::assertion_error(this,&local_148);
    __cxa_throw(this,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tVar5 = tVar4;
  if (value < 0) {
    std::__cxx11::string::push_back((char)result);
    tVar5 = tVar4 + 1;
  }
  for (pbVar6 = local_128 + (tVar4 - 1); local_128 <= pbVar6; pbVar6 = pbVar6 + -1) {
    std::__cxx11::string::push_back((char)result);
  }
  return tVar5;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }